

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool redit_name(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  ROOM_INDEX_DATA *pRVar2;
  char *pcVar3;
  
  cVar1 = *argument;
  if (cVar1 == '\0') {
    pcVar3 = "Syntax:  name [name]\n\r";
  }
  else {
    pRVar2 = ch->in_room;
    free_pstring(pRVar2->name);
    pcVar3 = palloc_string(argument);
    pRVar2->name = pcVar3;
    pcVar3 = "Name set.\n\r";
  }
  send_to_char(pcVar3,ch);
  return cVar1 != '\0';
}

Assistant:

bool redit_name(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;

	EDIT_ROOM(ch, pRoom);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  name [name]\n\r", ch);
		return false;
	}

	free_pstring(pRoom->name);
	pRoom->name = palloc_string(argument);

	send_to_char("Name set.\n\r", ch);
	return true;
}